

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

UBool __thiscall icu_63::AndConstraint::isFulfilled(AndConstraint *this,IFixedDecimal *number)

{
  int iVar1;
  UVector32 *pUVar2;
  bool bVar3;
  long lVar4;
  double x;
  double dVar5;
  double dVar6;
  
  switch(this->digitsType) {
  case tVariableI:
    break;
  case tVariableF:
    break;
  case tVariableV:
    break;
  case tVariableT:
    break;
  default:
    if (this->digitsType == none) {
      return '\x01';
    }
  }
  (*number->_vptr_IFixedDecimal[2])(number);
  if (this->integerOnly == '\0') {
LAB_0026ffb2:
    dVar5 = x;
    if (this->op == MOD) {
      dVar5 = fmod(x,(double)this->opNum);
    }
    pUVar2 = this->rangeList;
    if (pUVar2 == (UVector32 *)0x0) {
      bVar3 = dVar5 == (double)this->value || this->value == -1;
      goto LAB_0027003e;
    }
    iVar1 = pUVar2->count;
    if (0 < (long)iVar1) {
      lVar4 = 0;
      do {
        if ((double)pUVar2->elements[lVar4] <= dVar5) {
          dVar6 = 0.0;
          if (lVar4 + 1U < (ulong)(long)iVar1) {
            dVar6 = (double)pUVar2->elements[lVar4 + 1];
          }
          if (dVar5 <= dVar6) {
            bVar3 = true;
            goto LAB_0027003e;
          }
        }
        lVar4 = lVar4 + 2;
      } while ((int)lVar4 < iVar1);
    }
  }
  else {
    dVar5 = uprv_floor_63(x);
    if ((x == dVar5) && (!NAN(x) && !NAN(dVar5))) goto LAB_0026ffb2;
  }
  bVar3 = false;
LAB_0027003e:
  return this->negated != '\0' ^ bVar3;
}

Assistant:

UBool
AndConstraint::isFulfilled(const IFixedDecimal &number) {
    UBool result = TRUE;
    if (digitsType == none) {
        // An empty AndConstraint, created by a rule with a keyword but no following expression.
        return TRUE;
    }

    PluralOperand operand = tokenTypeToPluralOperand(digitsType);
    double n = number.getPluralOperand(operand);     // pulls n | i | v | f value for the number.
                                                     // Will always be positive.
                                                     // May be non-integer (n option only)
    do {
        if (integerOnly && n != uprv_floor(n)) {
            result = FALSE;
            break;
        }

        if (op == MOD) {
            n = fmod(n, opNum);
        }
        if (rangeList == nullptr) {
            result = value == -1 ||    // empty rule
                     n == value;       //  'is' rule
            break;
        }
        result = FALSE;                // 'in' or 'within' rule
        for (int32_t r=0; r<rangeList->size(); r+=2) {
            if (rangeList->elementAti(r) <= n && n <= rangeList->elementAti(r+1)) {
                result = TRUE;
                break;
            }
        }
    } while (FALSE);

    if (negated) {
        result = !result;
    }
    return result;
}